

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence.hpp
# Opt level: O1

void __thiscall biosoup::Sequence::ReverseAndComplement(Sequence *this)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  pointer pcVar7;
  size_type sVar8;
  
  sVar2 = (this->data)._M_string_length;
  if (sVar2 != 0) {
    pcVar7 = (this->data)._M_dataplus._M_p;
    sVar8 = 0;
    do {
      iVar4 = toupper((uint)(byte)pcVar7[sVar8]);
      uVar5 = (int)(char)iVar4 - 0x41;
      if ((uVar5 < 0x19) && ((0x13a14cfU >> (uVar5 & 0x1f) & 1) != 0)) {
        pcVar7[sVar8] = (&DAT_00119070)[uVar5];
      }
      sVar8 = sVar8 + 1;
    } while (sVar2 != sVar8);
  }
  pcVar3 = (this->data)._M_dataplus._M_p;
  sVar2 = (this->data)._M_string_length;
  pcVar7 = pcVar3 + (sVar2 - 1);
  if (pcVar3 < pcVar7 && sVar2 != 0) {
    do {
      pcVar6 = pcVar3 + 1;
      cVar1 = *pcVar3;
      *pcVar3 = *pcVar7;
      *pcVar7 = cVar1;
      pcVar7 = pcVar7 + -1;
      pcVar3 = pcVar6;
    } while (pcVar6 < pcVar7);
  }
  pcVar3 = (this->quality)._M_dataplus._M_p;
  sVar2 = (this->quality)._M_string_length;
  pcVar7 = pcVar3 + (sVar2 - 1);
  if (pcVar3 < pcVar7 && sVar2 != 0) {
    do {
      pcVar6 = pcVar3 + 1;
      cVar1 = *pcVar3;
      *pcVar3 = *pcVar7;
      *pcVar7 = cVar1;
      pcVar7 = pcVar7 + -1;
      pcVar3 = pcVar6;
    } while (pcVar6 < pcVar7);
  }
  return;
}

Assistant:

void ReverseAndComplement() {  // (optional) Watson-Crick base pairing
    for (auto& it : data) {
      switch (static_cast<char>(std::toupper(static_cast<unsigned char>(it)))) {
        case 'A': it = 'T'; break;
        case 'C': it = 'G'; break;
        case 'G': it = 'C'; break;
        case 'T': case 'U': it = 'A'; break;
        case 'R': it = 'Y'; break;  // A || G
        case 'Y': it = 'R'; break;  // C || T (U)
        case 'K': it = 'M'; break;  // G || T (U)
        case 'M': it = 'K'; break;  // A || C
        case 'S': break;  // C || G
        case 'W': break;  // A || T (U)
        case 'B': it = 'V'; break;  // !A
        case 'D': it = 'H'; break;  // !C
        case 'H': it = 'D'; break;  // !G
        case 'V': it = 'B'; break;  // !T (!U)
        default: break;  // N || -
      }
    }
    std::reverse(data.begin(), data.end());
    std::reverse(quality.begin(), quality.end());
  }